

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ReadDebugSectionsFromSegment<segment_command_64,section_64>
               (LoadCommand cmd,File *dwarf,RangeSink *sink)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_type sVar4;
  string_view *psVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char *__string;
  bool bVar11;
  string_view name;
  string_view data;
  string_view sVar12;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  File *local_50;
  RangeSink *local_48;
  size_t local_40;
  char *local_38;
  
  local_50 = dwarf;
  local_48 = sink;
  if (0x47 < cmd.command_data._M_len) {
    sVar2 = strnlen(cmd.command_data._M_str + 8,0x10);
    if (((sVar2 == 7) &&
        (*(int *)(cmd.command_data._M_str + 0xb) == 0x46524157 &&
         *(int *)(cmd.command_data._M_str + 8) == 0x57445f5f)) &&
       (iVar9 = *(int *)(cmd.command_data._M_str + 0x40), iVar9 != 0)) {
      uVar10 = cmd.command_data._M_len - 0x48;
      __string = cmd.command_data._M_str + 0x48;
      local_38 = cmd.file_data._M_str;
      local_40 = cmd.file_data._M_len;
      do {
        sVar1 = local_40;
        bVar11 = uVar10 < 0x50;
        uVar10 = uVar10 - 0x50;
        if (bVar11) goto LAB_0018f6b3;
        local_60._M_len = strnlen(__string,0x10);
        uVar3 = *(ulong *)(__string + 0x28);
        if (((byte)__string[0x40] < 0x13) && ((0x41002U >> ((byte)__string[0x40] & 0x1f) & 1) != 0))
        {
          uVar3 = 0;
        }
        uVar6 = (ulong)*(uint *)(__string + 0x30);
        local_60._M_str = __string;
        if (CARRY8(uVar3,uVar6)) {
          Throw("integer overflow in addition",0x4b);
        }
        if (sVar1 < uVar3 + uVar6) {
          Throw("region out-of-bounds",0x5d);
        }
        uVar8 = sVar1 - uVar6;
        if (uVar3 <= uVar8) {
          uVar8 = uVar3;
        }
        piVar7 = (int *)(local_38 + uVar6);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&local_60,"__debug_",0,8);
        if (sVar4 == 0) {
          sVar12._M_str = local_60._M_str + 8;
          sVar12._M_len = local_60._M_len - 8;
          local_60._M_len = sVar12._M_len;
          local_60._M_str = sVar12._M_str;
          psVar5 = bloaty::dwarf::File::GetFieldByName(local_50,sVar12);
          if (psVar5 != (string_view *)0x0) {
            psVar5->_M_len = uVar8;
LAB_0018f688:
            psVar5->_M_str = (char *)piVar7;
          }
        }
        else {
          sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_60,"__zdebug_",0,9);
          if (sVar4 == 0) {
            name._M_str = local_60._M_str + 9;
            name._M_len = local_60._M_len - 9;
            local_60._M_len = name._M_len;
            local_60._M_str = name._M_str;
            psVar5 = bloaty::dwarf::File::GetFieldByName(local_50,name);
            if (psVar5 != (string_view *)0x0) {
              if (uVar8 < 4) {
                Throw("premature EOF reading variable-length DWARF data",0xad);
              }
              if (*piVar7 == 0x42494c5a) {
                if (uVar8 - 4 < 8) {
                  Throw("premature EOF reading fixed-length data",0x8d);
                }
                uVar3 = *(ulong *)(piVar7 + 1);
                data._M_str = (char *)(piVar7 + 3);
                data._M_len = uVar8 - 0xc;
                sVar12 = RangeSink::ZlibDecompress
                                   (local_48,data,
                                    uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                                    (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                                    (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                                    (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
                piVar7 = (int *)sVar12._M_str;
                psVar5->_M_len = sVar12._M_len;
                goto LAB_0018f688;
              }
            }
          }
        }
        __string = __string + 0x50;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    return;
  }
LAB_0018f6b3:
  Throw("Premature EOF reading Mach-O data.",0x36);
}

Assistant:

void ReadDebugSectionsFromSegment(LoadCommand cmd, dwarf::File *dwarf,
                                  RangeSink *sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  if (segname != "__DWARF") {
    return;
  }

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);
    string_view sectname = ArrayToStr(section->sectname, 16);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    string_view contents =
        StrictSubstr(cmd.file_data, section->offset, filesize);

    if (sectname.find("__debug_") == 0) {
      sectname.remove_prefix(string_view("__debug_").size());
      dwarf->SetFieldByName(sectname, contents);
    } else if (sectname.find("__zdebug_") == 0) {
      sectname.remove_prefix(string_view("__zdebug_").size());
      string_view *member = dwarf->GetFieldByName(sectname);
      if (!member || ReadBytes(4, &contents) != "ZLIB") {
        continue;
      }
      auto uncompressed_size = ReadBigEndian<uint64_t>(&contents);
      *member = sink->ZlibDecompress(contents, uncompressed_size);
    }
  }
}